

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O2

bool __thiscall
booster::aio::basic_socket::get_option(basic_socket *this,boolean_option_type opt,error_code *e)

{
  int __optname;
  int __fd;
  int iVar1;
  error_code eVar2;
  int value;
  socklen_t len;
  
  value = 0;
  len = 4;
  if (opt == reuse_address) {
    __fd = basic_io_device::native(&this->super_basic_io_device);
    iVar1 = 1;
    __optname = 2;
  }
  else if (opt == keep_alive) {
    __fd = basic_io_device::native(&this->super_basic_io_device);
    iVar1 = 1;
    __optname = 9;
  }
  else {
    if (opt != tcp_no_delay) {
      return false;
    }
    __fd = basic_io_device::native(&this->super_basic_io_device);
    iVar1 = 6;
    __optname = 1;
  }
  iVar1 = getsockopt(__fd,iVar1,__optname,&value,&len);
  if (iVar1 < 0) {
    eVar2 = socket_details::geterror();
    e->_M_value = eVar2._M_value;
    e->_M_cat = eVar2._M_cat;
    return false;
  }
  return value != 0;
}

Assistant:

bool basic_socket::get_option(boolean_option_type opt,system::error_code &e)
{
	int value = 0;
	socklen_t len = sizeof(value);
	#ifdef BOOSTER_WIN32
	char *ptr = reinterpret_cast<char *>(&value);
	#else
	int *ptr = &value;
	#endif
	int res = 0;
	switch(opt) {
	case tcp_no_delay:
		res=::getsockopt(native(),IPPROTO_TCP,TCP_NODELAY,ptr,&len);
		break;
	case keep_alive:
		res=::getsockopt(native(),SOL_SOCKET,SO_KEEPALIVE,ptr,&len);
		break;
	case reuse_address:
		res=::getsockopt(native(),SOL_SOCKET,SO_REUSEADDR,ptr,&len);
		break;
	default:
		;
	}
	if(res < 0) {
		e=geterror();
		return false;
	}
	return value!=0;
}